

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedModeFunction<unsigned_long,duckdb::ModeStandard<unsigned_long>>(LogicalType *type)

{
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *func;
  AggregateFunction *this;
  AggregateFunction *input_type;
  
  this = in_RDI;
  input_type = in_RDI;
  LogicalType::LogicalType((LogicalType *)in_RDI,(LogicalType *)in_RDI);
  LogicalType::LogicalType((LogicalType *)this,(LogicalType *)in_RDI);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,unsigned_long,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>,(duckdb::AggregateDestructorType)1>
            ((LogicalType *)input_type,in_RSI);
  LogicalType::~LogicalType((LogicalType *)0x1ccb15e);
  LogicalType::~LogicalType((LogicalType *)0x1ccb168);
  in_RDI->window =
       ModeFunction<duckdb::ModeStandard<unsigned_long>>::
       Window<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,unsigned_long>
  ;
  return this;
}

Assistant:

AggregateFunction GetTypedModeFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = ModeFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, type);
	func.window = OP::template Window<STATE, INPUT_TYPE, INPUT_TYPE>;
	return func;
}